

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
          (QMovableArrayOps<QVariant> *this,qsizetype i,QVariant *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<QVariant> *in_RSI;
  QArrayDataPointer<QVariant> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QVariant tmp;
  QVariant *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff94;
  byte bVar6;
  GrowthPosition where;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined8 local_10;
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QVariant>::needsDetach
                    ((QArrayDataPointer<QVariant> *)
                     CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QVariant> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QVariant>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QVariant>::end
                ((QArrayDataPointer<QVariant> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      QVariant::QVariant(in_stack_ffffffffffffff78,(QVariant *)0x1425e2);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00142764;
    }
    if ((in_RSI == (QArrayDataPointer<QVariant> *)0x0) &&
       (qVar3 = QArrayDataPointer<QVariant>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QVariant>::begin((QArrayDataPointer<QVariant> *)0x14261a);
      QVariant::QVariant(in_stack_ffffffffffffff78,(QVariant *)0x14262b);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00142764;
    }
  }
  local_28.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  local_28._8_8_ = 0xaaaaaaaaaaaaaaaa;
  local_28._16_8_ = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QVariant::QVariant(in_stack_ffffffffffffff78,(QVariant *)0x14268e);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QVariant> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QVariant> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QVariant>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff94,uVar2))),
             (QVariant **)in_RDI,
             (QArrayDataPointer<QVariant> *)CONCAT17(uVar5,in_stack_ffffffffffffff80));
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter((Inserter *)
                       CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff94,uVar2))),
                       in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffff80),
                       (qsizetype)in_stack_ffffffffffffff78);
    Inserter::insertOne((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    Inserter::~Inserter((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffff80));
  }
  else {
    QArrayDataPointer<QVariant>::begin((QArrayDataPointer<QVariant> *)0x1426f8);
    QVariant::QVariant(in_stack_ffffffffffffff78,(QVariant *)0x142709);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QVariant::~QVariant((QVariant *)&local_28);
LAB_00142764:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }